

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O2

UnicodeString ** __thiscall
icu_63::DateFormatSymbols::getZoneStrings
          (DateFormatSymbols *this,int32_t *rowCount,int32_t *columnCount)

{
  UnicodeString **ppUVar1;
  
  umtx_lock_63((UMutex *)LOCK);
  ppUVar1 = this->fZoneStrings;
  if ((ppUVar1 == (UnicodeString **)0x0) &&
     (ppUVar1 = this->fLocaleZoneStrings, ppUVar1 == (UnicodeString **)0x0)) {
    initZoneStringsArray(this);
    ppUVar1 = this->fLocaleZoneStrings;
  }
  *rowCount = this->fZoneStringsRowCount;
  *columnCount = this->fZoneStringsColCount;
  umtx_unlock_63((UMutex *)LOCK);
  return ppUVar1;
}

Assistant:

const UnicodeString**
DateFormatSymbols::getZoneStrings(int32_t& rowCount, int32_t& columnCount) const
{
    const UnicodeString **result = NULL;

    umtx_lock(&LOCK);
    if (fZoneStrings == NULL) {
        if (fLocaleZoneStrings == NULL) {
            ((DateFormatSymbols*)this)->initZoneStringsArray();
        }
        result = (const UnicodeString**)fLocaleZoneStrings;
    } else {
        result = (const UnicodeString**)fZoneStrings;
    }
    rowCount = fZoneStringsRowCount;
    columnCount = fZoneStringsColCount;
    umtx_unlock(&LOCK);

    return result;
}